

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O2

void __thiscall test_result_wrapper::fail_if(test_result_wrapper *this,bool condition,char *text)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,condition) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
    poVar1 = std::operator<<(poVar1,text);
    std::operator<<(poVar1,"\n");
    this->pass = false;
  }
  return;
}

Assistant:

void fail_if(bool condition, const char *text){
        if (condition){
            cerr << "ERROR: " << text << "\n";
            pass = false;
        }
    }